

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

char * ngram_type_to_str(int type)

{
  char *pcStack_10;
  int type_local;
  
  if (type == 1) {
    pcStack_10 = "arpa";
  }
  else if (type == 2) {
    pcStack_10 = "dmp/bin";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

char const *
ngram_type_to_str(int type)
{
    switch (type) {
    case NGRAM_ARPA:
        return "arpa";
    case NGRAM_BIN:
        return "dmp/bin";
    default:
        return NULL;
    }
}